

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

uint32_t get_literal_price(lzma_lzma1_encoder *coder,uint32_t pos,uint32_t prev_byte,
                          _Bool match_mode,uint32_t match_byte,uint32_t symbol)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  uint uVar4;
  
  bVar1 = (byte)coder->literal_context_bits;
  if ((int)CONCAT71(in_register_00000009,match_mode) != 0) {
    uVar4 = symbol + 0x100;
    uVar2 = 0;
    uVar3 = 0x100;
    do {
      match_byte = match_byte * 2;
      uVar2 = uVar2 + lzma_rc_prices
                      [((uint)(int)(char)uVar4 >> 7 & 0x7f0 ^
                       (uint)coder->literal
                             [(prev_byte >> (8 - bVar1 & 0x1f)) +
                              ((pos & coder->literal_pos_mask) << (bVar1 & 0x1f))]
                             [(uVar4 >> 8) + uVar3 + (match_byte & uVar3)]) >> 4];
      uVar4 = uVar4 * 2;
      uVar3 = uVar3 & ~(uVar4 ^ match_byte);
    } while (uVar4 < 0x10000);
    return uVar2;
  }
  uVar2 = rc_bittree_price(coder->literal
                           [(prev_byte >> (8 - bVar1 & 0x1f)) +
                            ((pos & coder->literal_pos_mask) << (bVar1 & 0x1f))],8,symbol);
  return uVar2;
}

Assistant:

static uint32_t
get_literal_price(const lzma_lzma1_encoder *const coder, const uint32_t pos,
		const uint32_t prev_byte, const bool match_mode,
		uint32_t match_byte, uint32_t symbol)
{
	const probability *const subcoder = literal_subcoder(coder->literal,
			coder->literal_context_bits, coder->literal_pos_mask,
			pos, prev_byte);

	uint32_t price = 0;

	if (!match_mode) {
		price = rc_bittree_price(subcoder, 8, symbol);
	} else {
		uint32_t offset = 0x100;
		symbol += UINT32_C(1) << 8;

		do {
			match_byte <<= 1;

			const uint32_t match_bit = match_byte & offset;
			const uint32_t subcoder_index
					= offset + match_bit + (symbol >> 8);
			const uint32_t bit = (symbol >> 7) & 1;
			price += rc_bit_price(subcoder[subcoder_index], bit);

			symbol <<= 1;
			offset &= ~(match_byte ^ symbol);

		} while (symbol < (UINT32_C(1) << 16));
	}

	return price;
}